

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

int GetBestPredictorForTile
              (int width,int height,int tile_x,int tile_y,int bits,int (*accumulated) [256],
              uint32_t *argb_scratch,uint32_t *argb,int max_quantization,int exact,
              int used_subtract_green,uint32_t *modes)

{
  int (*paiVar1) [256];
  uint width_00;
  uint height_00;
  long lVar2;
  byte bVar3;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  uint32_t in_EDI;
  uint32_t in_R8D;
  long in_R9;
  long in_stack_00000008;
  long in_stack_00000010;
  int in_stack_00000018;
  undefined4 in_stack_00000020;
  int in_stack_00000028;
  long in_stack_00000030;
  int (*tmp_1) [256];
  uint32_t *tmp;
  int relative_x;
  int y;
  int relative_y;
  float cur_diff;
  uint32_t residuals [64];
  int j;
  int i;
  int (*best_histo) [256];
  int (*histo_argb) [256];
  int histo_stack_2 [4] [256];
  int histo_stack_1 [4] [256];
  int mode;
  int best_mode;
  float best_diff;
  uint8_t *max_diffs;
  uint32_t *current_row;
  uint32_t *upper_row;
  int above_mode;
  int left_mode;
  int tiles_per_row;
  int context_width;
  int context_start_x;
  int have_left;
  int max_x;
  int max_y;
  int tile_size;
  int start_y;
  int start_x;
  int kNumPredModes;
  int in_stack_ffffffffffffddf8;
  int in_stack_ffffffffffffddfc;
  int in_stack_ffffffffffffde00;
  int in_stack_ffffffffffffde04;
  undefined4 in_stack_ffffffffffffde08;
  undefined4 in_stack_ffffffffffffde0c;
  int in_stack_ffffffffffffde10;
  int in_stack_ffffffffffffde14;
  int x_start;
  int in_stack_ffffffffffffde38;
  int y_00;
  float local_21bc;
  uint32_t in_stack_ffffffffffffde48;
  int in_stack_ffffffffffffde50;
  int in_stack_ffffffffffffde58;
  uint32_t *in_stack_ffffffffffffde60;
  int local_20b0;
  int local_20ac;
  int (*local_20a8) [256];
  int (*local_20a0) [256];
  int local_2098 [1024];
  int local_1098 [1025];
  uint local_94;
  uint local_90;
  float local_8c;
  long local_88;
  long local_80;
  long local_78;
  uint local_70;
  uint local_6c;
  uint32_t local_68;
  int local_64;
  int local_60;
  uint local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48;
  undefined4 local_44;
  long local_40;
  uint32_t local_34;
  int local_30;
  int local_2c;
  int local_28;
  uint32_t local_24;
  
  local_44 = 0xe;
  bVar3 = (byte)in_R8D;
  local_48 = in_EDX << (bVar3 & 0x1f);
  local_4c = in_ECX << (bVar3 & 0x1f);
  local_50 = 1 << (bVar3 & 0x1f);
  local_40 = in_R9;
  local_34 = in_R8D;
  local_30 = in_ECX;
  local_2c = in_EDX;
  local_28 = in_ESI;
  local_24 = in_EDI;
  local_54 = GetMin(local_50,in_ESI - local_4c);
  local_58 = GetMin(local_50,local_24 - local_48);
  local_5c = (uint)(0 < local_48);
  local_60 = local_48 - local_5c;
  local_64 = local_58 + local_5c + (uint)(local_58 < (int)(local_24 - local_48));
  local_68 = VP8LSubSampleSize(local_24,local_34);
  if (local_2c < 1) {
    width_00 = 0xff;
  }
  else {
    width_00 = *(uint *)(in_stack_00000030 + (long)(int)(local_30 * local_68 + local_2c + -1) * 4)
               >> 8 & 0xff;
  }
  if (local_30 < 1) {
    height_00 = 0xff;
  }
  else {
    height_00 = *(uint *)(in_stack_00000030 + (long)(int)((local_30 + -1) * local_68 + local_2c) * 4
                         ) >> 8 & 0xff;
  }
  local_78 = in_stack_00000008;
  local_80 = in_stack_00000008 + (long)(int)local_24 * 4 + 4;
  local_88 = local_80 + (long)(int)local_24 * 4 + 4;
  local_8c = 1e+30;
  local_90 = 0;
  local_20a0 = (int (*) [256])local_1098;
  local_20a8 = (int (*) [256])local_2098;
  local_70 = height_00;
  local_6c = width_00;
  for (local_94 = 0; paiVar1 = local_20a0, (int)local_94 < 0xe; local_94 = local_94 + 1) {
    memset(local_20a0,0,0x1000);
    if (0 < local_4c) {
      memcpy((void *)(local_80 + (long)local_60 * 4),
             (void *)(in_stack_00000010 + (long)(int)((local_4c + -1) * local_24) * 4 +
                     (long)local_60 * 4),(long)(int)(local_58 + local_5c + 1) << 2);
    }
    for (y_00 = 0; lVar2 = local_78, y_00 < local_54; y_00 = y_00 + 1) {
      in_stack_ffffffffffffddf8 = local_4c + y_00;
      local_78 = local_80;
      local_80 = lVar2;
      memcpy((void *)(lVar2 + (long)local_60 * 4),
             (void *)(in_stack_00000010 + (long)(int)(in_stack_ffffffffffffddf8 * local_24) * 4 +
                     (long)local_60 * 4),
             (long)(int)(local_58 + local_5c + (uint)(in_stack_ffffffffffffddf8 + 1 < local_28)) <<
             2);
      x_start = (int)lVar2;
      if (((1 < in_stack_00000018) && (0 < in_stack_ffffffffffffddf8)) &&
         (in_stack_ffffffffffffddf8 + 1 < local_28)) {
        MaxDiffsForRow(in_stack_ffffffffffffde14,in_stack_ffffffffffffde10,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_ffffffffffffde08),
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffde04,in_stack_ffffffffffffde00),
                       in_stack_ffffffffffffddfc);
      }
      in_stack_ffffffffffffde00 = in_stack_00000018;
      in_stack_ffffffffffffde08 = in_stack_00000020;
      in_stack_ffffffffffffde10 = in_stack_00000028;
      GetResidual(width_00,height_00,(uint32_t *)&stack0xffffffffffffde48,
                  (uint32_t *)CONCAT44(in_stack_ffffffffffffde14,in_stack_00000028),
                  (uint8_t *)CONCAT44(in_stack_ffffffffffffde0c,in_stack_00000020),
                  in_stack_ffffffffffffde04,x_start,in_stack_ffffffffffffde38,y_00,
                  in_stack_ffffffffffffde48,in_stack_ffffffffffffde50,in_stack_ffffffffffffde58,
                  in_stack_ffffffffffffde60);
      for (in_stack_ffffffffffffde38 = 0; in_stack_ffffffffffffde38 < local_58;
          in_stack_ffffffffffffde38 = in_stack_ffffffffffffde38 + 1) {
        UpdateHisto(local_20a0,
                    *(uint32_t *)(&stack0xffffffffffffde48 + (long)in_stack_ffffffffffffde38 * 4));
      }
    }
    local_21bc = PredictionCostSpatialHistogram
                           ((int (*) [256])
                            CONCAT44(in_stack_ffffffffffffde04,in_stack_ffffffffffffde00),
                            (int (*) [256])
                            CONCAT44(in_stack_ffffffffffffddfc,in_stack_ffffffffffffddf8));
    if (local_94 == local_6c) {
      local_21bc = local_21bc - 15.0;
    }
    if (local_94 == local_70) {
      local_21bc = local_21bc - 15.0;
    }
    if (local_21bc < local_8c) {
      local_20a0 = local_20a8;
      local_20a8 = paiVar1;
      local_8c = local_21bc;
      local_90 = local_94;
    }
  }
  for (local_20ac = 0; local_20ac < 4; local_20ac = local_20ac + 1) {
    for (local_20b0 = 0; local_20b0 < 0x100; local_20b0 = local_20b0 + 1) {
      lVar2 = local_40 + (long)local_20ac * 0x400;
      *(int *)(lVar2 + (long)local_20b0 * 4) =
           local_20a8[local_20ac][local_20b0] + *(int *)(lVar2 + (long)local_20b0 * 4);
    }
  }
  return local_90;
}

Assistant:

static int GetBestPredictorForTile(int width, int height,
                                   int tile_x, int tile_y, int bits,
                                   int accumulated[4][256],
                                   uint32_t* const argb_scratch,
                                   const uint32_t* const argb,
                                   int max_quantization,
                                   int exact, int used_subtract_green,
                                   const uint32_t* const modes) {
  const int kNumPredModes = 14;
  const int start_x = tile_x << bits;
  const int start_y = tile_y << bits;
  const int tile_size = 1 << bits;
  const int max_y = GetMin(tile_size, height - start_y);
  const int max_x = GetMin(tile_size, width - start_x);
  // Whether there exist columns just outside the tile.
  const int have_left = (start_x > 0);
  // Position and size of the strip covering the tile and adjacent columns if
  // they exist.
  const int context_start_x = start_x - have_left;
#if (WEBP_NEAR_LOSSLESS == 1)
  const int context_width = max_x + have_left + (max_x < width - start_x);
#endif
  const int tiles_per_row = VP8LSubSampleSize(width, bits);
  // Prediction modes of the left and above neighbor tiles.
  const int left_mode = (tile_x > 0) ?
      (modes[tile_y * tiles_per_row + tile_x - 1] >> 8) & 0xff : 0xff;
  const int above_mode = (tile_y > 0) ?
      (modes[(tile_y - 1) * tiles_per_row + tile_x] >> 8) & 0xff : 0xff;
  // The width of upper_row and current_row is one pixel larger than image width
  // to allow the top right pixel to point to the leftmost pixel of the next row
  // when at the right edge.
  uint32_t* upper_row = argb_scratch;
  uint32_t* current_row = upper_row + width + 1;
  uint8_t* const max_diffs = (uint8_t*)(current_row + width + 1);
  float best_diff = MAX_DIFF_COST;
  int best_mode = 0;
  int mode;
  int histo_stack_1[4][256];
  int histo_stack_2[4][256];
  // Need pointers to be able to swap arrays.
  int (*histo_argb)[256] = histo_stack_1;
  int (*best_histo)[256] = histo_stack_2;
  int i, j;
  uint32_t residuals[1 << MAX_TRANSFORM_BITS];
  assert(bits <= MAX_TRANSFORM_BITS);
  assert(max_x <= (1 << MAX_TRANSFORM_BITS));

  for (mode = 0; mode < kNumPredModes; ++mode) {
    float cur_diff;
    int relative_y;
    memset(histo_argb, 0, sizeof(histo_stack_1));
    if (start_y > 0) {
      // Read the row above the tile which will become the first upper_row.
      // Include a pixel to the left if it exists; include a pixel to the right
      // in all cases (wrapping to the leftmost pixel of the next row if it does
      // not exist).
      memcpy(current_row + context_start_x,
             argb + (start_y - 1) * width + context_start_x,
             sizeof(*argb) * (max_x + have_left + 1));
    }
    for (relative_y = 0; relative_y < max_y; ++relative_y) {
      const int y = start_y + relative_y;
      int relative_x;
      uint32_t* tmp = upper_row;
      upper_row = current_row;
      current_row = tmp;
      // Read current_row. Include a pixel to the left if it exists; include a
      // pixel to the right in all cases except at the bottom right corner of
      // the image (wrapping to the leftmost pixel of the next row if it does
      // not exist in the current row).
      memcpy(current_row + context_start_x,
             argb + y * width + context_start_x,
             sizeof(*argb) * (max_x + have_left + (y + 1 < height)));
#if (WEBP_NEAR_LOSSLESS == 1)
      if (max_quantization > 1 && y >= 1 && y + 1 < height) {
        MaxDiffsForRow(context_width, width, argb + y * width + context_start_x,
                       max_diffs + context_start_x, used_subtract_green);
      }
#endif

      GetResidual(width, height, upper_row, current_row, max_diffs, mode,
                  start_x, start_x + max_x, y, max_quantization, exact,
                  used_subtract_green, residuals);
      for (relative_x = 0; relative_x < max_x; ++relative_x) {
        UpdateHisto(histo_argb, residuals[relative_x]);
      }
    }
    cur_diff = PredictionCostSpatialHistogram(
        (const int (*)[256])accumulated, (const int (*)[256])histo_argb);
    // Favor keeping the areas locally similar.
    if (mode == left_mode) cur_diff -= kSpatialPredictorBias;
    if (mode == above_mode) cur_diff -= kSpatialPredictorBias;

    if (cur_diff < best_diff) {
      int (*tmp)[256] = histo_argb;
      histo_argb = best_histo;
      best_histo = tmp;
      best_diff = cur_diff;
      best_mode = mode;
    }
  }

  for (i = 0; i < 4; i++) {
    for (j = 0; j < 256; j++) {
      accumulated[i][j] += best_histo[i][j];
    }
  }

  return best_mode;
}